

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_fatalfailure_tests.cpp
# Opt level: O2

void __thiscall
iu_NoFatalFailureTest_x_iutest_x_Expect_Test::Body
          (iu_NoFatalFailureTest_x_iutest_x_Expect_Test *this)

{
  iuCodeMessage local_1c0;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&iutest_failure_checker);
  OccurNonFatalFailure();
  iutest::detail::NewTestPartResultCheckHelper::ReporterHolder::~ReporterHolder
            (&iutest_failure_checker.m_holder);
  if (0 < iutest_failure_checker.m_count) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_fatalfailure_tests.cpp"
               ,0x26,
               "\nExpected: OccurNonFatalFailure() doesn\'t generate new fatal failure.\n  Actual: it does."
              );
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1c0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  return;
}

Assistant:

IUTEST(NoFatalFailureTest, Expect)
{
    IUTEST_EXPECT_NO_FATAL_FAILURE(OccurNonFatalFailure());
}